

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

uint * Aig_ManSuppCharStart(Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  uint *puVar2;
  int i;
  
  puVar2 = (uint *)calloc(1,(long)(int)(((nPis >> 5) + 1) - (uint)((nPis & 0x1fU) == 0)) << 2);
  i = 0;
  while( true ) {
    if (vOne->nSize <= i) {
      return puVar2;
    }
    iVar1 = Vec_IntEntry(vOne,i);
    if (nPis <= iVar1) break;
    puVar2[iVar1 >> 5] = puVar2[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
    i = i + 1;
  }
  __assert_fail("Entry < nPis",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,0x1df,"unsigned int *Aig_ManSuppCharStart(Vec_Int_t *, int)");
}

Assistant:

unsigned * Aig_ManSuppCharStart( Vec_Int_t * vOne, int nPis )
{
    unsigned * pBuffer;
    int i, Entry;
    int nWords = Abc_BitWordNum(nPis);
    pBuffer = ABC_ALLOC( unsigned, nWords );
    memset( pBuffer, 0, sizeof(unsigned) * nWords );
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
    return pBuffer;
}